

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

void capnp::compiler::anon_unknown_0::checkExampleField
               (Reader reader,Field field,uint sharedOrdinalCount)

{
  Reader type;
  Reader reader_00;
  Field FVar1;
  uint ordinal_00;
  Which WVar2;
  undefined8 in_stack_fffffffffffffd88;
  Reader *__return_storage_ptr__;
  Reader local_208;
  ReaderFor<capnp::DynamicStruct> local_1c0;
  Reader local_178;
  Reader local_148;
  RawBrandedSchema *local_118;
  undefined8 uStack_110;
  SegmentReader *local_108;
  CapTableReader *pCStack_100;
  void *local_f8;
  WirePointer *pWStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Reader local_d0;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uint local_44;
  undefined1 local_40 [4];
  uint ordinal;
  Reader fieldProto;
  uint sharedOrdinalCount_local;
  
  fieldProto._reader._44_4_ = sharedOrdinalCount;
  StructSchema::Field::getProto((Reader *)local_40,&field);
  WVar2 = capnp::schema::Field::Reader::which((Reader *)local_40);
  if (WVar2 == SLOT) {
    memcpy(local_88,&field,0x40);
    FVar1._8_8_ = local_78;
    FVar1.parent.super_Schema.raw = (Schema)(Schema)uStack_80;
    FVar1.proto._reader.segment = (SegmentReader *)uStack_70;
    FVar1.proto._reader.capTable = (CapTableReader *)local_68;
    FVar1.proto._reader.data = (void *)uStack_60;
    FVar1.proto._reader.pointers = (WirePointer *)local_58;
    FVar1.proto._reader.dataSize = (undefined4)uStack_50;
    FVar1.proto._reader.pointerCount = uStack_50._4_2_;
    FVar1.proto._reader._38_2_ = uStack_50._6_2_;
    FVar1.proto._reader._40_8_ = in_stack_fffffffffffffd88;
    local_44 = getOrdinal(FVar1);
    FVar1 = field;
    if (local_44 < (uint)fieldProto._reader._44_4_) {
      local_118 = (RawBrandedSchema *)field.parent.super_Schema.raw;
      uStack_110._0_4_ = field.index;
      uStack_110._4_4_ = field._12_4_;
      field.proto._reader.segment = FVar1.proto._reader.segment;
      local_108 = field.proto._reader.segment;
      field.proto._reader.capTable = FVar1.proto._reader.capTable;
      pCStack_100 = field.proto._reader.capTable;
      field.proto._reader.data = FVar1.proto._reader.data;
      local_f8 = field.proto._reader.data;
      field.proto._reader.pointers = FVar1.proto._reader.pointers;
      pWStack_f0 = field.proto._reader.pointers;
      field.proto._reader._32_8_ = FVar1.proto._reader._32_8_;
      local_e8._0_4_ = field.proto._reader.dataSize;
      local_e8._4_2_ = field.proto._reader.pointerCount;
      local_e8._6_2_ = field.proto._reader._38_2_;
      field.proto._reader._40_8_ = FVar1.proto._reader._40_8_;
      uStack_e0._0_4_ = field.proto._reader.nestingLimit;
      uStack_e0._4_4_ = field.proto._reader._44_4_;
      field = FVar1;
      DynamicStruct::Reader::get(&local_d0,&reader,FVar1);
      ordinal_00 = local_44;
      capnp::schema::Field::Reader::getSlot(&local_178,(Reader *)local_40);
      capnp::schema::Field::Slot::Reader::getType(&local_148,&local_178);
      type._reader.capTable = local_148._reader.capTable;
      type._reader.segment = local_148._reader.segment;
      type._reader.data = local_148._reader.data;
      type._reader.pointers = local_148._reader.pointers;
      type._reader.dataSize = local_148._reader.dataSize;
      type._reader.pointerCount = local_148._reader.pointerCount;
      type._reader._38_2_ = local_148._reader._38_2_;
      type._reader.nestingLimit = local_148._reader.nestingLimit;
      type._reader._44_4_ = local_148._reader._44_4_;
      checkExampleValue(&local_d0,ordinal_00,type,fieldProto._reader._44_4_);
      DynamicValue::Reader::~Reader(&local_d0);
    }
  }
  else if (WVar2 == GROUP) {
    __return_storage_ptr__ = &local_208;
    DynamicStruct::Reader::get(__return_storage_ptr__,&reader,field);
    DynamicValue::Reader::as<capnp::DynamicStruct>(&local_1c0,__return_storage_ptr__);
    reader_00.reader.segment = local_1c0.reader.segment;
    reader_00.schema.super_Schema.raw = local_1c0.schema.super_Schema.raw;
    reader_00.reader.capTable = local_1c0.reader.capTable;
    reader_00.reader.data = local_1c0.reader.data;
    reader_00.reader.pointers = local_1c0.reader.pointers;
    reader_00.reader.dataSize = local_1c0.reader.dataSize;
    reader_00.reader.pointerCount = local_1c0.reader.pointerCount;
    reader_00.reader._38_2_ = local_1c0.reader._38_2_;
    reader_00.reader.nestingLimit = local_1c0.reader.nestingLimit;
    reader_00.reader._44_4_ = local_1c0.reader._44_4_;
    checkExampleStruct(reader_00,fieldProto._reader._44_4_);
    DynamicValue::Reader::~Reader(&local_208);
  }
  return;
}

Assistant:

void checkExampleField(DynamicStruct::Reader reader, StructSchema::Field field,
                       uint sharedOrdinalCount) {
  auto fieldProto = field.getProto();
  switch (fieldProto.which()) {
    case schema::Field::SLOT: {
      uint ordinal = getOrdinal(field);
      if (ordinal < sharedOrdinalCount) {
        checkExampleValue(reader.get(field), ordinal,
                          fieldProto.getSlot().getType(), sharedOrdinalCount);
      }
      break;
    }
    case schema::Field::GROUP:
      checkExampleStruct(reader.get(field).as<DynamicStruct>(), sharedOrdinalCount);
      break;
  }
}